

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O1

bool __thiscall efsw::FileInfo::operator==(FileInfo *this,FileInfo *Other)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar2[0] = -((char)Other->ModificationTime == (char)this->ModificationTime);
  auVar2[1] = -(*(char *)((long)&Other->ModificationTime + 1) ==
               *(char *)((long)&this->ModificationTime + 1));
  auVar2[2] = -(*(char *)((long)&Other->ModificationTime + 2) ==
               *(char *)((long)&this->ModificationTime + 2));
  auVar2[3] = -(*(char *)((long)&Other->ModificationTime + 3) ==
               *(char *)((long)&this->ModificationTime + 3));
  auVar2[4] = -(*(char *)((long)&Other->ModificationTime + 4) ==
               *(char *)((long)&this->ModificationTime + 4));
  auVar2[5] = -(*(char *)((long)&Other->ModificationTime + 5) ==
               *(char *)((long)&this->ModificationTime + 5));
  auVar2[6] = -(*(char *)((long)&Other->ModificationTime + 6) ==
               *(char *)((long)&this->ModificationTime + 6));
  auVar2[7] = -(*(char *)((long)&Other->ModificationTime + 7) ==
               *(char *)((long)&this->ModificationTime + 7));
  auVar2[8] = -((char)Other->Size == (char)this->Size);
  auVar2[9] = -(*(char *)((long)&Other->Size + 1) == *(char *)((long)&this->Size + 1));
  auVar2[10] = -(*(char *)((long)&Other->Size + 2) == *(char *)((long)&this->Size + 2));
  auVar2[0xb] = -(*(char *)((long)&Other->Size + 3) == *(char *)((long)&this->Size + 3));
  auVar2[0xc] = -(*(char *)((long)&Other->Size + 4) == *(char *)((long)&this->Size + 4));
  auVar2[0xd] = -(*(char *)((long)&Other->Size + 5) == *(char *)((long)&this->Size + 5));
  auVar2[0xe] = -(*(char *)((long)&Other->Size + 6) == *(char *)((long)&this->Size + 6));
  auVar2[0xf] = -(*(char *)((long)&Other->Size + 7) == *(char *)((long)&this->Size + 7));
  auVar1[0] = -(*(char *)((long)&Other->Size + 4) == *(char *)((long)&this->Size + 4));
  auVar1[1] = -(*(char *)((long)&Other->Size + 5) == *(char *)((long)&this->Size + 5));
  auVar1[2] = -(*(char *)((long)&Other->Size + 6) == *(char *)((long)&this->Size + 6));
  auVar1[3] = -(*(char *)((long)&Other->Size + 7) == *(char *)((long)&this->Size + 7));
  auVar1[4] = -((char)Other->OwnerId == (char)this->OwnerId);
  auVar1[5] = -(*(char *)((long)&Other->OwnerId + 1) == *(char *)((long)&this->OwnerId + 1));
  auVar1[6] = -(*(char *)((long)&Other->OwnerId + 2) == *(char *)((long)&this->OwnerId + 2));
  auVar1[7] = -(*(char *)((long)&Other->OwnerId + 3) == *(char *)((long)&this->OwnerId + 3));
  auVar1[8] = -((char)Other->GroupId == (char)this->GroupId);
  auVar1[9] = -(*(char *)((long)&Other->GroupId + 1) == *(char *)((long)&this->GroupId + 1));
  auVar1[10] = -(*(char *)((long)&Other->GroupId + 2) == *(char *)((long)&this->GroupId + 2));
  auVar1[0xb] = -(*(char *)((long)&Other->GroupId + 3) == *(char *)((long)&this->GroupId + 3));
  auVar1[0xc] = -((char)Other->Permissions == (char)this->Permissions);
  auVar1[0xd] = -(*(char *)((long)&Other->Permissions + 1) ==
                 *(char *)((long)&this->Permissions + 1));
  auVar1[0xe] = -(*(char *)((long)&Other->Permissions + 2) ==
                 *(char *)((long)&this->Permissions + 2));
  auVar1[0xf] = -(*(char *)((long)&Other->Permissions + 3) ==
                 *(char *)((long)&this->Permissions + 3));
  auVar1 = auVar1 & auVar2;
  if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar1[0xf] >> 7) << 0xf) != 0xffff) {
    return false;
  }
  return this->Inode == Other->Inode;
}

Assistant:

bool FileInfo::operator==( const FileInfo& Other ) const {
	return ( ModificationTime == Other.ModificationTime && Size == Other.Size &&
			 OwnerId == Other.OwnerId && GroupId == Other.GroupId &&
			 Permissions == Other.Permissions && Inode == Other.Inode );
}